

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_>::~AttachmentPromiseNode
          (AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_> *this)

{
  AttachmentPromiseNode<kj::Own<kj::NetworkAddress>_> *this_local;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  Own<kj::NetworkAddress>::~Own(&this->attachment);
  AttachmentPromiseNodeBase::~AttachmentPromiseNodeBase(&this->super_AttachmentPromiseNodeBase);
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }